

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O1

void burstsort_mkq_simpleburst_4(uchar **strings,size_t N)

{
  byte bVar1;
  char cVar2;
  iterator __position;
  long lVar3;
  void *pvVar4;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *pvVar5;
  uint *oracle;
  TSTNode<unsigned_int> *pTVar6;
  sbyte sVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  size_t sVar12;
  long lVar13;
  size_t sVar14;
  ulong uVar15;
  uint uVar16;
  TSTNode<unsigned_int> *pTVar17;
  uchar *str;
  TSTNode<unsigned_int> root;
  BurstSimple<unsigned_int> local_85;
  uint local_84;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *local_80;
  uchar **local_78;
  byte *local_70;
  size_t local_68;
  size_t local_60;
  TSTNode<unsigned_int> local_58;
  
  local_58.buckets._M_elems[2] = (void *)0x0;
  local_58.is_tst.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  local_58.buckets._M_elems[0] = (void *)0x0;
  local_58.buckets._M_elems[1] = (void *)0x0;
  local_84 = pseudo_median<unsigned_int>(strings,N,0);
  local_58.pivot = local_84;
  local_60 = N;
  if (N != 0) {
    sVar14 = 0;
    local_78 = strings;
    do {
      local_70 = strings[sVar14];
      if (local_70 == (byte *)0x0) {
LAB_002135a5:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x38,"uint32_t get_char(unsigned char *, size_t)");
      }
      if (*local_70 == 0) {
        uVar9 = 0;
      }
      else {
        uVar9 = (uint)*local_70 << 0x18;
        if (local_70[1] != 0) {
          uVar9 = uVar9 | (uint)local_70[1] << 0x10;
          if (local_70[2] != 0) {
            uVar9 = uVar9 | CONCAT11(local_70[2],local_70[3]);
          }
        }
      }
      uVar16 = (uint)(uVar9 == local_84) + (uint)(local_84 <= uVar9 && uVar9 != local_84) * 2;
      sVar7 = (sbyte)uVar16;
      pTVar17 = &local_58;
      sVar11 = 0;
      uVar10 = (uint)local_58.is_tst.super__Base_bitset<1UL>._M_w;
      while( true ) {
        if ((uVar10 >> uVar16 & 1) == 0) break;
        sVar12 = sVar11;
        if (uVar16 == 1) {
          sVar12 = sVar11 + 4;
          if (local_70[sVar11 + 4] == 0) {
            uVar9 = 0;
          }
          else {
            uVar9 = (uint)local_70[sVar11 + 4] << 0x18;
            if (local_70[sVar11 + 5] != 0) {
              uVar9 = uVar9 | (uint)local_70[sVar11 + 5] << 0x10;
              if (local_70[sVar11 + 6] != 0) {
                uVar9 = uVar9 | CONCAT11(local_70[sVar11 + 6],local_70[sVar11 + 7]);
              }
            }
          }
        }
        pTVar17 = (TSTNode<unsigned_int> *)(pTVar17->buckets)._M_elems[uVar16];
        uVar10 = pTVar17->pivot;
        uVar16 = (uint)(uVar9 == uVar10) + (uint)(uVar10 <= uVar9 && uVar9 != uVar10) * 2;
        uVar10 = (uint)(pTVar17->is_tst).super__Base_bitset<1UL>._M_w;
        sVar7 = (sbyte)uVar16;
        sVar11 = sVar12;
      }
      pvVar5 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
               (pTVar17->buckets)._M_elems[uVar16];
      if (pvVar5 == (vector<unsigned_char*,std::allocator<unsigned_char*>> *)0x0) {
        pvVar5 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)operator_new(0x18);
        *(undefined8 *)pvVar5 = 0;
        *(undefined8 *)(pvVar5 + 8) = 0;
        *(undefined8 *)(pvVar5 + 0x10) = 0;
        (pTVar17->buckets)._M_elems[uVar16] = pvVar5;
      }
      __position._M_current = *(uchar ***)(pvVar5 + 8);
      if (__position._M_current == *(uchar ***)(pvVar5 + 0x10)) {
        std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
        _M_realloc_insert<unsigned_char*const&>(pvVar5,__position,&local_70);
        strings = local_78;
      }
      else {
        *__position._M_current = local_70;
        *(long *)(pvVar5 + 8) = *(long *)(pvVar5 + 8) + 8;
      }
      if ((uVar16 != 1) || ((char)pTVar17->pivot != '\0')) {
        lVar3 = *(long *)pvVar5;
        lVar13 = *(long *)(pvVar5 + 8) - lVar3;
        uVar15 = lVar13 >> 3;
        if ((0x8000 < uVar15) && (*(long *)(pvVar5 + 8) == *(long *)(pvVar5 + 0x10))) {
          sVar12 = sVar11 + 4;
          if (uVar16 != 1) {
            sVar12 = sVar11;
          }
          local_80 = pvVar5;
          local_68 = sVar14;
          oracle = (uint *)malloc(lVar13 >> 1);
          uVar9 = 1;
          uVar8 = 0;
          do {
            lVar13 = *(long *)(lVar3 + uVar8 * 8);
            if (lVar13 == 0) goto LAB_002135a5;
            if (*(byte *)(lVar13 + sVar12) == 0) {
              uVar10 = 0;
            }
            else {
              uVar10 = (uint)*(byte *)(lVar13 + sVar12) << 0x18;
              bVar1 = *(byte *)(lVar13 + 1 + sVar12);
              if (bVar1 != 0) {
                uVar10 = uVar10 | (uint)bVar1 << 0x10;
                cVar2 = *(char *)(lVar13 + 2 + sVar12);
                if (cVar2 != '\0') {
                  uVar10 = uVar10 | CONCAT11(cVar2,*(undefined1 *)(lVar13 + 3 + sVar12));
                }
              }
            }
            oracle[uVar8] = uVar10;
            uVar8 = (ulong)uVar9;
            uVar9 = uVar9 + 1;
          } while (uVar8 < uVar15);
          verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
                    (&local_58,0);
          pvVar5 = local_80;
          pTVar6 = BurstSimple<unsigned_int>::operator()
                             (&local_85,
                              (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)local_80,
                              oracle,sVar12);
          free(oracle);
          pvVar4 = *(void **)pvVar5;
          if (pvVar4 != (void *)0x0) {
            operator_delete(pvVar4);
            pvVar5 = local_80;
          }
          operator_delete(pvVar5);
          (pTVar17->buckets)._M_elems[uVar16] = pTVar6;
          (pTVar17->is_tst).super__Base_bitset<1UL>._M_w =
               (pTVar17->is_tst).super__Base_bitset<1UL>._M_w | 1L << sVar7;
          verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
                    (&local_58,0);
          sVar14 = local_68;
          strings = local_78;
        }
      }
      sVar14 = sVar14 + 1;
    } while (sVar14 != local_60);
  }
  verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>(&local_58,0);
  burst_traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_int>
            (&local_58,strings,0,0);
  return;
}

Assistant:

void burstsort_mkq_simpleburst_4(unsigned char** strings, size_t N)
{ burstsort_mkq_simpleburst<uint32_t>(strings, N); }